

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O2

BasicValue * __thiscall
cmm::CMMInterpreter::callUserFunction
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,FunctionDefinitionAST *Function,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args,VariableEnv *Env)

{
  undefined8 uVar1;
  undefined8 extraout_RAX;
  BasicType Type;
  BasicType Type_00;
  BasicType Type_01;
  BasicType Type_02;
  FunctionDefinitionAST *extraout_RDX;
  FunctionDefinitionAST *__rhs;
  CMMInterpreter *pCVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  ExecutionResult Result;
  VariableEnv FuncEnv;
  FunctionDefinitionAST *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [40];
  undefined1 local_110 [32];
  string local_f0;
  undefined1 local_d0 [72];
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  _Rb_tree_node_base local_78;
  size_t local_58;
  string local_50;
  
  __rhs = Function;
  local_138._32_8_ = __return_storage_ptr__;
  if ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl._M_node.
      _M_size ==
      (Function->ParameterList).super__List_base<cmm::Parameter,_std::allocator<cmm::Parameter>_>.
      _M_impl._M_node._M_size) {
    local_88 = (undefined1  [8])&this->TopLevelEnv;
    if (Env != (VariableEnv *)0x0) {
      local_88 = (undefined1  [8])Env;
    }
    local_78._M_left = &local_78;
    local_78._M_color = _S_red;
    local_78._M_parent = (_Base_ptr)0x0;
    local_58 = 0;
    p_Var3 = (_List_node_base *)&Function->ParameterList;
    p_Var4 = (_List_node_base *)Args;
    local_78._M_right = local_78._M_left;
    while (p_Var4 = (((_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)
                     &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          local_1c0 = Function, p_Var4 != (_List_node_base *)Args) {
      p_Var3 = (((_List_base<cmm::Parameter,_std::allocator<cmm::Parameter>_> *)&p_Var3->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (*(int *)&p_Var3[3]._M_next != *(int *)&p_Var4[1]._M_next) {
        if ((*(int *)&p_Var3[3]._M_next != 2) || (*(int *)&p_Var4[1]._M_next != 1)) {
          std::operator+(&local_1b8,"in function `",&Function->Name);
          std::operator+(&local_198,&local_1b8,"\', parameter `");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var3 + 1));
          std::operator+(&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,"\' has type ");
          cvm::TypeToStr_abi_cxx11_
                    ((string *)(local_110 + 0x20),(cvm *)(ulong)*(uint *)&p_Var3[3]._M_next,Type);
          std::operator+(&local_158,&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,&local_158,", but argument is ");
          cvm::TypeToStr_abi_cxx11_
                    (&local_50,(cvm *)(ulong)((BasicValue *)(p_Var4 + 1))->Type,Type_00);
          pCVar2 = (CMMInterpreter *)local_d0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_138,&local_50);
          RuntimeError(pCVar2,(string *)local_d0);
          __rhs = extraout_RDX;
          goto LAB_0010a6eb;
        }
        p_Var4[3]._M_prev = (_List_node_base *)(double)*(int *)&p_Var4[3]._M_prev;
        *(undefined4 *)&p_Var4[1]._M_next = 2;
      }
      if (p_Var3[1]._M_prev != (_List_node_base *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cvm::BasicValue>,std::_Select1st<std::pair<std::__cxx11::string_const,cvm::BasicValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cvm::BasicValue>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,cvm::BasicValue&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cvm::BasicValue>,std::_Select1st<std::pair<std::__cxx11::string_const,cvm::BasicValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cvm::BasicValue>>>
                    *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,(BasicValue *)(p_Var4 + 1));
      }
    }
    executeStatement((ExecutionResult *)local_d0,this,(VariableEnv *)local_88,
                     (Function->Statement)._M_t.
                     super___uniq_ptr_impl<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmm::StatementAST_*,_std::default_delete<cmm::StatementAST>_>
                     .super__Head_base<0UL,_cmm::StatementAST_*,_false>._M_head_impl);
    uVar1 = local_138._32_8_;
    if ((local_d0._0_4_ != ReturnStatementResult) || (local_d0._8_4_ == Function->Type)) {
      cvm::BasicValue::BasicValue((BasicValue *)local_138._32_8_,(BasicValue *)(local_d0 + 8));
      cvm::BasicValue::~BasicValue((BasicValue *)(local_d0 + 8));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
                   *)local_80);
      return (BasicValue *)uVar1;
    }
  }
  else {
LAB_0010a6eb:
    Function = (FunctionDefinitionAST *)local_110;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Function,
                   "Function `",&__rhs->Name);
    std::operator+(&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Function,
                   "\' expects ");
    std::__cxx11::to_string
              (&local_198,
               (__rhs->ParameterList).
               super__List_base<cmm::Parameter,_std::allocator<cmm::Parameter>_>._M_impl._M_node.
               _M_size);
    std::operator+(&local_158,&local_178,&local_198);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_158," parameter(s), ");
    std::__cxx11::to_string
              (&local_1b8,
               (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
               _M_node._M_size);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_1b8);
    pCVar2 = (CMMInterpreter *)local_d0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   " argument(s) provided");
    RuntimeError(pCVar2,(string *)local_d0);
  }
  std::operator+(&local_198,"function `",&Function->Name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_198,"\' ought to return ");
  cvm::TypeToStr_abi_cxx11_(&local_1b8,(cvm *)(ulong)local_1c0->Type,Type_01);
  std::operator+(&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_1b8);
  std::operator+(&local_158,&local_178,", but got ");
  cvm::TypeToStr_abi_cxx11_((string *)(local_110 + 0x20),(cvm *)(ulong)(uint)local_d0._8_4_,Type_02)
  ;
  pCVar2 = (CMMInterpreter *)local_138;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2,
                 &local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_110 + 0x20));
  RuntimeError(pCVar2,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)(local_110 + 0x20));
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)&local_198);
  cvm::BasicValue::~BasicValue((BasicValue *)(local_d0 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
               *)local_80);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

cvm::BasicValue
CMMInterpreter::callUserFunction(const FunctionDefinitionAST &Function,
                                 std::list<cvm::BasicValue> &Args,
                                 VariableEnv *Env) {
  if (Args.size() != Function.getParameterCount()) {
    RuntimeError("Function `" + Function.getName() + "' expects " +
        std::to_string(Function.getParameterCount()) + " parameter(s), " +
        std::to_string(Args.size()) + " argument(s) provided");
  }

  VariableEnv FuncEnv(Env ? Env : &TopLevelEnv);

  auto It = Function.getParameterList().cbegin();
  auto End = Function.getParameterList().cend();
  for (cvm::BasicValue &Arg : Args) {
    if (It->getType() != Arg.Type) {
      if (Arg.isInt() && It->getType() == cvm::DoubleType) {
        Arg.DoubleVal = Arg.IntVal;
        Arg.Type = cvm::DoubleType;
      } else {
        RuntimeError("in function `" + Function.getName() + "', parameter `" +
          It->getName() + "' has type " + cvm::TypeToStr(It->getType()) +
          ", but argument is " + cvm::TypeToStr(Arg.Type));
      }
    }

    if (!It->getName().empty()) // We allow empty parameter name.
      FuncEnv.VarMap.emplace(It->getName(), Arg);
    ++It;
  }

  ExecutionResult Result = executeStatement(&FuncEnv, Function.getStatement());
  if (Result.Kind == ExecutionResult::ReturnStatementResult &&
      Result.ReturnValue.Type != Function.getType()) {
    RuntimeError("function `" + Function.getName() + "' ought to return " +
        cvm::TypeToStr(Function.getType()) + ", but got " +
        cvm::TypeToStr(Result.ReturnValue.Type));
  }
  return Result.ReturnValue;
}